

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_cjson.c
# Opt level: O0

int json_encode(lua_State *l)

{
  int iVar1;
  int local_4c;
  char *pcStack_48;
  int len;
  char *json;
  strbuf_t *encode_buf;
  strbuf_t local_encode_buf;
  json_config_t *cfg;
  lua_State *l_local;
  
  local_encode_buf._24_8_ = json_fetch_config(l);
  iVar1 = lua_gettop(l);
  if (iVar1 != 1) {
    luaL_argerror(l,1,"expected 1 argument");
  }
  if (*(int *)(local_encode_buf._24_8_ + 0x538) == 0) {
    json = (char *)&encode_buf;
    strbuf_init((strbuf_t *)json,0);
  }
  else {
    json = (char *)(local_encode_buf._24_8_ + 0x500);
    strbuf_reset((strbuf_t *)json);
  }
  json_append_data(l,(json_config_t *)local_encode_buf._24_8_,0,(strbuf_t *)json);
  pcStack_48 = strbuf_string((strbuf_t *)json,&local_4c);
  lua_pushlstring(l,pcStack_48,(long)local_4c);
  if (*(int *)(local_encode_buf._24_8_ + 0x538) == 0) {
    strbuf_free((strbuf_t *)json);
  }
  return 1;
}

Assistant:

static int json_encode(lua_State *l)
{
    json_config_t *cfg = json_fetch_config(l);
    strbuf_t local_encode_buf;
    strbuf_t *encode_buf;
    char *json;
    int len;

    luaL_argcheck(l, lua_gettop(l) == 1, 1, "expected 1 argument");

    if (!cfg->encode_keep_buffer) {
        /* Use private buffer */
        encode_buf = &local_encode_buf;
        strbuf_init(encode_buf, 0);
    } else {
        /* Reuse existing buffer */
        encode_buf = &cfg->encode_buf;
        strbuf_reset(encode_buf);
    }

    json_append_data(l, cfg, 0, encode_buf);
    json = strbuf_string(encode_buf, &len);

    lua_pushlstring(l, json, len);

    if (!cfg->encode_keep_buffer)
        strbuf_free(encode_buf);

    return 1;
}